

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O2

int minTemp2_fast_iVar5(uint *pInOut,int iQ,int jQ,int nWords,int *pDifStart)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  iVar2 = nWords * 2;
  lVar3 = (long)(nWords * 2 + -1);
  iVar1 = 0;
  do {
    if (lVar3 < 0) {
      iVar2 = 0;
LAB_0048a330:
      *pDifStart = iVar2;
      return iVar1;
    }
    iVar4 = -(uint)(pInOut[lVar3 - iQ] < pInOut[lVar3 - jQ]);
    if (pInOut[lVar3 - jQ] < pInOut[lVar3 - iQ]) {
      iVar4 = 1;
    }
    if (iVar4 != 0) {
      iVar1 = 0;
      if (iVar4 != -1) {
        iVar1 = 1;
      }
      goto LAB_0048a330;
    }
    lVar3 = lVar3 + -4;
    iVar2 = iVar2 + -4;
  } while( true );
}

Assistant:

int minTemp2_fast_iVar5(unsigned* pInOut, int iQ, int jQ, int nWords, int* pDifStart)
{
    int i, temp;
//     printf("in minTemp2_fast_iVar5\n");

    for(i=(nWords)*2 - 1; i>=0; i-=4)   
    {
        temp = CompareWords(pInOut[i-iQ],pInOut[i-jQ]);
        if(temp == 0)
            continue;
        else if(temp == -1)
        {
            *pDifStart = i+1;
            return 0;
        }
        else
        {
            *pDifStart = i+1;
            return 1;
        }
    }
    *pDifStart=0;
    return 0;
}